

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_write_u64(mpack_writer_t *writer,uint64_t value)

{
  _Bool _Var1;
  uint8_t *u;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  
  if (value < 0x80) {
    pcVar3 = writer->current;
    if (writer->end == pcVar3) {
      _Var1 = mpack_writer_ensure(writer,1);
      if (!_Var1) {
        return;
      }
      pcVar3 = writer->current;
    }
    *pcVar3 = (char)value;
    lVar2 = 1;
  }
  else if (value < 0x100) {
    pcVar3 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar3) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar3 = writer->current;
    }
    *pcVar3 = -0x34;
    pcVar3[1] = (char)value;
    lVar2 = 2;
  }
  else if (value < 0x10000) {
    pcVar3 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar3) < 3) {
      _Var1 = mpack_writer_ensure(writer,3);
      if (!_Var1) {
        return;
      }
      pcVar3 = writer->current;
    }
    *pcVar3 = -0x33;
    *(ushort *)(pcVar3 + 1) = (ushort)value << 8 | (ushort)value >> 8;
    lVar2 = 3;
  }
  else {
    pcVar3 = writer->current;
    uVar4 = (long)writer->end - (long)pcVar3;
    if (value >> 0x20 == 0) {
      if (uVar4 < 5) {
        _Var1 = mpack_writer_ensure(writer,5);
        if (!_Var1) {
          return;
        }
        pcVar3 = writer->current;
      }
      *pcVar3 = -0x32;
      uVar5 = (uint)value;
      *(uint *)(pcVar3 + 1) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      lVar2 = 5;
    }
    else {
      if (uVar4 < 9) {
        _Var1 = mpack_writer_ensure(writer,9);
        if (!_Var1) {
          return;
        }
        pcVar3 = writer->current;
      }
      *pcVar3 = -0x31;
      *(uint64_t *)(pcVar3 + 1) =
           value >> 0x38 | (value & 0xff000000000000) >> 0x28 | (value & 0xff0000000000) >> 0x18 |
           (value & 0xff00000000) >> 8 | (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 |
           (value & 0xff00) << 0x28 | value << 0x38;
      lVar2 = 9;
    }
  }
  writer->current = writer->current + lVar2;
  return;
}

Assistant:

void mpack_write_u64(mpack_writer_t* writer, uint64_t value) {
    mpack_writer_track_element(writer);

    if (value <= 127) {
        MPACK_WRITE_ENCODED(mpack_encode_fixuint, MPACK_TAG_SIZE_FIXUINT, (uint8_t)value);
    } else if (value <= UINT8_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u8, MPACK_TAG_SIZE_U8, (uint8_t)value);
    } else if (value <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u16, MPACK_TAG_SIZE_U16, (uint16_t)value);
    } else if (value <= UINT32_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u32, MPACK_TAG_SIZE_U32, (uint32_t)value);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_u64, MPACK_TAG_SIZE_U64, value);
    }
}